

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<short>::test_one<(libdivide::Branching)0>
          (DivideTest<short> *this,short numer,short denom,
          divider<short,_(libdivide::Branching)0> *the_divider)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  short *in_RCX;
  short in_DX;
  ushort in_SI;
  short result;
  short expect;
  int16_t q_1;
  int16_t sign_1;
  uint16_t uq_1;
  int16_t q;
  uint16_t uq;
  uint16_t mask;
  uint16_t sign;
  uint8_t shift;
  int32_t rl;
  int32_t yl;
  int32_t xl;
  int in_stack_ffffffffffffff64;
  DivideTest<short> *in_stack_ffffffffffffff68;
  short local_22;
  short local_12;
  
  uVar3 = std::numeric_limits<short>::min();
  if ((in_SI != uVar3) || (in_DX != -1)) {
    bVar1 = *(byte *)(in_RCX + 1);
    bVar2 = bVar1 & 0x1f;
    if (*in_RCX == 0) {
      uVar3 = (ushort)((int)(char)bVar1 >> 7);
      local_12 = ((ushort)((int)(short)(in_SI + ((short)in_SI >> 0xf & (short)(1 << bVar2) - 1U)) >>
                          bVar2) ^ uVar3) - uVar3;
    }
    else {
      local_22 = (short)((uint)((int)(short)in_SI * (int)*in_RCX) >> 0x10);
      if ((bVar1 & 0x40) != 0) {
        uVar3 = (ushort)((int)(char)bVar1 >> 7);
        local_22 = local_22 + ((in_SI ^ uVar3) - uVar3);
      }
      local_12 = (short)((int)local_22 >> bVar2);
      local_12 = local_12 + (ushort)(local_12 < 0);
    }
    if (local_12 != (short)in_SI / in_DX) {
      std::operator<<((ostream *)&std::cerr,"Failure for ");
      testcase_name_abi_cxx11_(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
      std::operator<<((ostream *)&std::cerr,(string *)&stack0xffffffffffffff68);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
      std::operator<<((ostream *)&std::cerr,": ");
      std::ostream::operator<<((ostream *)&std::cerr,in_SI);
      std::operator<<((ostream *)&std::cerr," / ");
      std::ostream::operator<<((ostream *)&std::cerr,in_DX);
      std::operator<<((ostream *)&std::cerr," = ");
      std::ostream::operator<<((ostream *)&std::cerr,(short)in_SI / in_DX);
      std::operator<<((ostream *)&std::cerr,", but got ");
      std::ostream::operator<<((ostream *)&std::cerr,local_12);
      std::operator<<((ostream *)&std::cerr,"\n");
      exit(1);
    }
  }
  return;
}

Assistant:

void test_one(T numer, T denom, const divider<T, ALGO> &the_divider) {
        // Don't crash with INT_MIN / -1
        // INT_MIN / -1 is undefined behavior in C/C++
        if (limits::is_signed && numer == (limits::min)() && denom == T(-1)) {
            return;
        }

        T expect = numer / denom;
        T result = numer / the_divider;

        if (result != expect) {
            PRINT_ERROR(F("Failure for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(numer);
            PRINT_ERROR(F(" / "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(" = "));
            PRINT_ERROR(expect);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(result);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }
    }